

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void pmu_op_start_arm(CPUARMState *env)

{
  uint uVar1;
  
  pmccntr_op_start(env);
  if (((env->cp15).c9_pmcr & 0xf800) != 0) {
    uVar1 = 0;
    do {
      pmevcntr_op_start(env,(uint8_t)uVar1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < ((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f));
  }
  return;
}

Assistant:

void pmu_op_start(CPUARMState *env)
{
    unsigned int i;
    pmccntr_op_start(env);
    for (i = 0; i < pmu_num_counters(env); i++) {
        pmevcntr_op_start(env, i);
    }
}